

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_xar_doublelink.c
# Opt level: O2

void test_read_format_xar_doublelink(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *v1;
  archive_entry *ae;
  
  extract_reference_file("test_read_format_xar_doublelink.xar");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                   ,L'&',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_xar((archive *)a);
  if (iVar1 == 0) {
    wVar2 = archive_read_open_filename(a,"test_read_format_xar_doublelink.xar",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                        ,L'.',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                     ,L'0',(uint)(iVar1 == -0x1e),
                     "ARCHIVE_FATAL == archive_read_next_header(a, &ae)",a);
    v1 = archive_error_string((archive *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
               ,L'2',v1,"archive_error_string(a)","File with multiple link attributes",
               "\"File with multiple link attributes\"",(void *)0x0,L'\0');
    iVar1 = archive_errno((archive *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                     ,L'3',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
    iVar1 = archive_read_free((archive *)a);
    wVar2 = L'6';
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                   ,L')');
    test_skipping("XAR format unsupported");
    iVar1 = archive_read_free((archive *)a);
    wVar2 = L'*';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar_doublelink.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_xar_doublelink)
{
	const char *refname = "test_read_format_xar_doublelink.xar";
	struct archive *a;
	struct archive_entry *ae;

	extract_reference_file(refname);

	/* Verify with seeking reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
        if(ARCHIVE_OK != archive_read_support_format_xar(a)) {
                skipping("XAR format unsupported");
                assertEqualInt(ARCHIVE_OK, archive_read_free(a));
                return;
        }
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname,
	    10240));

	assertA(ARCHIVE_FATAL == archive_read_next_header(a, &ae));
	assertEqualString(archive_error_string(a),
		"File with multiple link attributes");
	assert(archive_errno(a) != 0);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}